

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

void __thiscall
MyClientConnection::OnData(MyClientConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  LogStringBuffer *buffer_15;
  uint in_ECX;
  byte *in_RDX;
  uint in_ESI;
  long in_RDI;
  bool validated;
  char *msgStart;
  uint32_t id_2;
  uint32_t id_1;
  uint32_t id;
  uint64_t owdUsec;
  uint64_t nowUsec;
  uint i_1;
  uint32_t packetIndex_1;
  uint32_t magic_1;
  uint64_t lo23;
  uint64_t lo16;
  uint32_t ts23;
  uint16_t ts16;
  uint i;
  uint32_t packetIndex;
  uint32_t magic;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_6;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_12;
  LogStringBuffer buffer_13;
  LogStringBuffer buffer_7;
  LogStringBuffer buffer_3;
  LogStringBuffer buffer_8;
  LogStringBuffer buffer_9;
  LogStringBuffer buffer_10;
  LogStringBuffer buffer_11;
  LogStringBuffer buffer_14;
  char *in_stack_ffffffffffffd318;
  LogStringBuffer *in_stack_ffffffffffffd320;
  uint64_t in_stack_ffffffffffffd328;
  OWDTimeStatistics *in_stack_ffffffffffffd330;
  LogStringBuffer *in_stack_ffffffffffffd358;
  OutputWorker *in_stack_ffffffffffffd360;
  Channel *pCVar1;
  OutputWorker *this_00;
  OWDTimeStatistics *in_stack_ffffffffffffd5e0;
  uint local_2a10;
  undefined1 local_2a09;
  byte *local_2a08;
  uint32_t local_29fc;
  uint32_t local_29f8;
  uint32_t local_29f4;
  int local_29f0;
  int local_29ec;
  long local_29e8;
  uint64_t local_29e0;
  uint local_29d4;
  uint local_29bc;
  uint32_t local_29b8;
  uint32_t local_29b4;
  uint64_t local_29b0;
  uint64_t local_29a8;
  uint32_t local_29a0;
  uint16_t local_299a;
  uint local_2998;
  uint32_t local_2994;
  uint32_t local_2990;
  uint local_298c;
  byte *local_2988;
  uint local_297c;
  char *local_2970;
  Channel *local_2968;
  char *local_2960;
  Channel *local_2958;
  char *local_2950;
  Channel *local_2948;
  char *local_2940;
  Channel *local_2938;
  char *local_2930;
  Channel *local_2928;
  char *local_2920;
  Channel *local_2918;
  char *local_2910;
  Channel *local_2908;
  char *local_2900;
  Channel *local_28f8;
  char *local_28f0;
  Channel *local_28e8;
  uint *local_28e0;
  char *local_28d8;
  int *local_28d0;
  char *local_28c8;
  int *local_28c0;
  char *local_28b8;
  Channel *local_28b0;
  uint *local_28a8;
  char *local_28a0;
  Channel *local_2898;
  uint *local_2890;
  char *local_2888;
  Channel *local_2880;
  char *local_2878;
  byte **local_2870;
  char *local_2868;
  uint *local_2860;
  char *local_2858;
  Channel *local_2850;
  char *local_2848;
  Channel *local_2840;
  uint *local_2838;
  char *local_2830;
  uint *local_2828;
  char *local_2820;
  Channel *local_2818;
  char *local_2810;
  undefined4 local_2804;
  Channel *local_2800;
  char *local_27f8;
  undefined4 local_27ec;
  Channel *local_27e8;
  undefined4 local_27dc;
  Channel *local_27d8;
  undefined4 local_27cc;
  Channel *local_27c8;
  undefined1 local_27b0 [16];
  ostream aoStack_27a0 [376];
  char *local_2628;
  undefined4 local_261c;
  Channel *local_2618;
  undefined1 local_2600 [16];
  ostream aoStack_25f0 [376];
  char *local_2478;
  undefined4 local_246c;
  Channel *local_2468;
  char *local_2460;
  undefined8 local_2458;
  undefined1 *local_2450;
  Channel *local_2448;
  char *local_2440;
  undefined8 local_2438;
  undefined1 *local_2430;
  Channel *local_2428;
  undefined8 local_2420;
  undefined1 *local_2418;
  Channel *local_2410;
  undefined8 local_2408;
  undefined1 *local_2400;
  Channel *local_23f8;
  char *local_23f0;
  undefined1 *local_23e8;
  Channel *local_23e0;
  char *local_23d8;
  undefined1 *local_23d0;
  Channel *local_23c8;
  undefined8 local_23c0;
  undefined1 *local_23b8;
  undefined8 local_23b0;
  undefined1 *local_23a8;
  char *local_23a0;
  undefined1 *local_2398;
  char *local_2390;
  undefined1 *local_2388;
  char *local_2380;
  undefined4 local_2374;
  Channel *local_2370;
  undefined4 local_2364;
  Channel *local_2360;
  char *local_2358;
  undefined4 local_234c;
  Channel *local_2348;
  undefined4 local_233c;
  Channel *local_2338;
  undefined1 local_2320 [16];
  ostream aoStack_2310 [376];
  char *local_2198;
  undefined4 local_218c;
  Channel *local_2188;
  undefined1 local_2170 [16];
  ostream aoStack_2160 [376];
  char *local_1fe8;
  undefined4 local_1fdc;
  Channel *local_1fd8;
  char *local_1fd0;
  undefined8 local_1fc8;
  undefined1 *local_1fc0;
  Channel *local_1fb8;
  undefined8 local_1fb0;
  undefined1 *local_1fa8;
  Channel *local_1fa0;
  undefined8 local_1f98;
  undefined1 *local_1f90;
  char *local_1f88;
  undefined8 local_1f80;
  undefined1 *local_1f78;
  Channel *local_1f70;
  undefined8 local_1f68;
  undefined1 *local_1f60;
  Channel *local_1f58;
  undefined8 local_1f50;
  undefined1 *local_1f48;
  char *local_1f40;
  undefined1 *local_1f38;
  Channel *local_1f30;
  char *local_1f28;
  undefined1 *local_1f20;
  Channel *local_1f18;
  char *local_1f10;
  undefined1 *local_1f08;
  char *local_1f00;
  undefined1 *local_1ef8;
  char *local_1ef0;
  undefined4 local_1ee4;
  Channel *local_1ee0;
  undefined4 local_1ed4;
  Channel *local_1ed0;
  char *local_1ec8;
  undefined4 local_1ebc;
  Channel *local_1eb8;
  undefined4 local_1eac;
  Channel *local_1ea8;
  char *local_1ea0;
  undefined4 local_1e94;
  Channel *local_1e90;
  undefined4 local_1e84;
  Channel *local_1e80;
  undefined1 local_1e68 [16];
  ostream aoStack_1e58 [376];
  char *local_1ce0;
  undefined4 local_1cd4;
  Channel *local_1cd0;
  undefined1 local_1cb8 [16];
  ostream aoStack_1ca8 [376];
  char *local_1b30;
  undefined4 local_1b24;
  Channel *local_1b20;
  undefined1 local_1b08 [16];
  ostream aoStack_1af8 [376];
  char *local_1980;
  undefined4 local_1974;
  Channel *local_1970;
  char *local_1968;
  undefined8 local_1960;
  undefined1 *local_1958;
  Channel *local_1950;
  undefined8 local_1948;
  undefined1 *local_1940;
  Channel *local_1938;
  undefined8 local_1930;
  undefined1 *local_1928;
  char *local_1920;
  undefined8 local_1918;
  undefined1 *local_1910;
  Channel *local_1908;
  undefined8 local_1900;
  undefined1 *local_18f8;
  Channel *local_18f0;
  undefined8 local_18e8;
  undefined1 *local_18e0;
  char *local_18d8;
  undefined8 local_18d0;
  undefined1 *local_18c8;
  Channel *local_18c0;
  undefined8 local_18b8;
  undefined1 *local_18b0;
  Channel *local_18a8;
  undefined8 local_18a0;
  undefined1 *local_1898;
  char *local_1890;
  undefined1 *local_1888;
  Channel *local_1880;
  char *local_1878;
  undefined1 *local_1870;
  Channel *local_1868;
  char *local_1860;
  undefined1 *local_1858;
  Channel *local_1850;
  char *local_1848;
  undefined1 *local_1840;
  char *local_1838;
  undefined1 *local_1830;
  char *local_1828;
  undefined1 *local_1820;
  char *local_1818;
  undefined4 local_180c;
  Channel *local_1808;
  undefined4 local_17fc;
  Channel *local_17f8;
  char *local_17f0;
  undefined4 local_17e4;
  Channel *local_17e0;
  undefined4 local_17d4;
  Channel *local_17d0;
  char *local_17c8;
  undefined4 local_17bc;
  Channel *local_17b8;
  undefined4 local_17ac;
  Channel *local_17a8;
  undefined1 local_1790 [16];
  ostream aoStack_1780 [376];
  char *local_1608;
  undefined4 local_15fc;
  Channel *local_15f8;
  undefined1 local_15e0 [16];
  ostream aoStack_15d0 [376];
  char *local_1458;
  undefined4 local_144c;
  Channel *local_1448;
  undefined1 local_1430 [16];
  ostream aoStack_1420 [376];
  char *local_12a8;
  undefined4 local_129c;
  Channel *local_1298;
  char *local_1290;
  undefined8 local_1288;
  undefined1 *local_1280;
  Channel *local_1278;
  undefined8 local_1270;
  undefined1 *local_1268;
  Channel *local_1260;
  undefined8 local_1258;
  undefined1 *local_1250;
  char *local_1248;
  undefined8 local_1240;
  undefined1 *local_1238;
  Channel *local_1230;
  undefined8 local_1228;
  undefined1 *local_1220;
  Channel *local_1218;
  undefined8 local_1210;
  undefined1 *local_1208;
  char *local_1200;
  string *local_11f8;
  undefined1 *local_11f0;
  OutputWorker *local_11e8;
  string *local_11e0;
  undefined1 *local_11d8;
  OutputWorker *local_11d0;
  string *local_11c8;
  undefined1 *local_11c0;
  char *local_11b8;
  undefined1 *local_11b0;
  OutputWorker *local_11a8;
  char *local_11a0;
  undefined1 *local_1198;
  Channel *local_1190;
  char *local_1188;
  undefined1 *local_1180;
  Channel *local_1178;
  char *local_1170;
  undefined1 *local_1168;
  char *local_1160;
  undefined1 *local_1158;
  char *local_1150;
  undefined1 *local_1148;
  uint *local_1140;
  char *local_1138;
  int *local_1130;
  char *local_1128;
  int *local_1120;
  char *local_1118;
  undefined4 local_110c;
  Channel *local_1108;
  undefined4 local_10fc;
  Channel *local_10f8;
  undefined1 local_10e0 [16];
  ostream aoStack_10d0 [376];
  uint *local_f58;
  char *local_f50;
  int *local_f48;
  char *local_f40;
  int *local_f38;
  char *local_f30;
  undefined4 local_f24;
  Channel *local_f20;
  uint *local_f18;
  char *local_f10;
  int *local_f08;
  char *local_f00;
  int *local_ef8;
  char *local_ef0;
  undefined8 local_ee8;
  undefined1 *local_ee0;
  Channel *local_ed8;
  undefined8 local_ed0;
  undefined1 *local_ec8;
  Channel *local_ec0;
  undefined8 local_eb8;
  undefined1 *local_eb0;
  uint *local_ea8;
  char *local_ea0;
  int *local_e98;
  char *local_e90;
  int *local_e88;
  char *local_e80;
  undefined1 *local_e78;
  Channel *local_e70;
  char *local_e68;
  undefined1 *local_e60;
  Channel *local_e58;
  uint *local_e50;
  char *local_e48;
  int *local_e40;
  char *local_e38;
  int *local_e30;
  undefined1 *local_e28;
  Channel *local_e20;
  char *local_e18;
  undefined1 *local_e10;
  int *local_e08;
  undefined1 *local_e00;
  Channel *local_df8;
  uint *local_df0;
  char *local_de8;
  int *local_de0;
  char *local_dd8;
  undefined1 *local_dd0;
  Channel *local_dc8;
  int *local_dc0;
  undefined1 *local_db8;
  char *local_db0;
  undefined1 *local_da8;
  Channel *local_da0;
  uint *local_d98;
  char *local_d90;
  int *local_d88;
  undefined1 *local_d80;
  Channel *local_d78;
  int *local_d70;
  undefined1 *local_d68;
  Channel *local_d60;
  int *local_d58;
  undefined1 *local_d50;
  char *local_d48;
  undefined1 *local_d40;
  uint *local_d38;
  char *local_d30;
  undefined1 *local_d28;
  Channel *local_d20;
  char *local_d18;
  undefined1 *local_d10;
  Channel *local_d08;
  uint *local_d00;
  undefined1 *local_cf8;
  Channel *local_cf0;
  char *local_ce8;
  undefined1 *local_ce0;
  uint *local_cd8;
  undefined1 *local_cd0;
  uint *local_cc8;
  char *local_cc0;
  undefined4 local_cb4;
  Channel *local_cb0;
  undefined4 local_ca4;
  Channel *local_ca0;
  undefined1 local_c88 [16];
  ostream aoStack_c78 [376];
  uint *local_b00;
  char *local_af8;
  undefined4 local_aec;
  Channel *local_ae8;
  uint *local_ae0;
  char *local_ad8;
  undefined8 local_ad0;
  undefined1 *local_ac8;
  Channel *local_ac0;
  undefined8 local_ab8;
  undefined1 *local_ab0;
  Channel *local_aa8;
  undefined8 local_aa0;
  undefined1 *local_a98;
  uint *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  Channel *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  Channel *local_a60;
  uint *local_a58;
  undefined1 *local_a50;
  Channel *local_a48;
  uint *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  uint *local_a20;
  char *local_a18;
  undefined4 local_a0c;
  Channel *local_a08;
  undefined4 local_9fc;
  Channel *local_9f8;
  undefined1 local_9e0 [16];
  ostream aoStack_9d0 [376];
  uint *local_858;
  char *local_850;
  undefined4 local_844;
  Channel *local_840;
  uint *local_838;
  char *local_830;
  undefined8 local_828;
  undefined1 *local_820;
  Channel *local_818;
  undefined8 local_810;
  undefined1 *local_808;
  Channel *local_800;
  undefined8 local_7f8;
  undefined1 *local_7f0;
  uint *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  Channel *local_7d0;
  uint *local_7c8;
  undefined1 *local_7c0;
  Channel *local_7b8;
  uint *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  Channel *local_790;
  char *local_788;
  undefined1 *local_780;
  char *local_778;
  byte **local_770;
  char *local_768;
  uint *local_760;
  char *local_758;
  undefined4 local_74c;
  Channel *local_748;
  undefined4 local_73c;
  Channel *local_738;
  undefined1 local_720 [16];
  ostream aoStack_710 [376];
  char *local_598;
  byte **local_590;
  char *local_588;
  uint *local_580;
  char *local_578;
  undefined4 local_56c;
  Channel *local_568;
  char *local_560;
  byte **local_558;
  char *local_550;
  uint *local_548;
  char *local_540;
  undefined8 local_538;
  undefined1 *local_530;
  Channel *local_528;
  undefined8 local_520;
  undefined1 *local_518;
  Channel *local_510;
  undefined8 local_508;
  undefined1 *local_500;
  char *local_4f8;
  byte **local_4f0;
  char *local_4e8;
  uint *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  Channel *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  Channel *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  byte **local_490;
  char *local_488;
  uint *local_480;
  undefined1 *local_478;
  Channel *local_470;
  uint *local_468;
  undefined1 *local_460;
  Channel *local_458;
  uint *local_450;
  undefined1 *local_448;
  char *local_440;
  byte **local_438;
  char *local_430;
  undefined1 *local_428;
  Channel *local_420;
  char *local_418;
  undefined1 *local_410;
  Channel *local_408;
  char *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  byte **local_3e8;
  undefined1 *local_3e0;
  Channel *local_3d8;
  byte **local_3d0;
  undefined1 *local_3c8;
  Channel *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  Channel *local_3a8;
  byte **local_3a0;
  undefined1 *local_398;
  char *local_390;
  undefined1 *local_388;
  uint *local_380;
  char *local_378;
  uint *local_370;
  char *local_368;
  undefined4 local_35c;
  Channel *local_358;
  undefined4 local_34c;
  Channel *local_348;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  uint *local_1a8;
  char *local_1a0;
  uint *local_198;
  char *local_190;
  undefined4 local_184;
  Channel *local_180;
  uint *local_178;
  char *local_170;
  uint *local_168;
  char *local_160;
  undefined8 local_158;
  undefined1 *local_150;
  Channel *local_148;
  undefined8 local_140;
  undefined1 *local_138;
  Channel *local_130;
  undefined8 local_128;
  undefined1 *local_120;
  uint *local_118;
  char *local_110;
  uint *local_108;
  char *local_100;
  undefined1 *local_f8;
  Channel *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  Channel *local_d8;
  uint *local_d0;
  char *local_c8;
  uint *local_c0;
  undefined1 *local_b8;
  Channel *local_b0;
  uint *local_a8;
  undefined1 *local_a0;
  Channel *local_98;
  uint *local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 *local_78;
  uint *local_70;
  char *local_68;
  undefined1 *local_60;
  Channel *local_58;
  uint *local_50;
  undefined1 *local_48;
  Channel *local_40;
  uint *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  if (((in_ESI != 0x9b) && (in_ESI != 0x37)) && (in_ECX != 0)) {
    if (*in_RDX == 200) {
      OnData::expected = OnData::expected + 1;
      if (in_RDX[1] != OnData::expected) {
        OnData::expected = in_RDX[1];
      }
    }
    else {
      local_298c = in_ECX;
      local_2988 = in_RDX;
      if (*in_RDX == 7) {
        if (in_ESI != 0x98) {
          local_2958 = &Logger;
          local_2960 = "Corrupted data: Wrong channel";
          local_2800 = &Logger;
          local_2804 = 4;
          local_2810 = "Corrupted data: Wrong channel";
          local_27c8 = &Logger;
          local_27cc = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_2468 = &Logger;
            local_246c = 4;
            local_2478 = "Corrupted data: Wrong channel";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_2458 = 0x12d358;
            local_2448 = &Logger;
            local_2460 = local_2478;
            local_23f8 = &Logger;
            local_2450 = local_2600;
            local_2408 = local_2458;
            local_2400 = local_2600;
            local_23c0 = local_2458;
            local_23b8 = local_2600;
            std::operator<<(aoStack_25f0,(string *)&Logger.Prefix);
            local_23c8 = &Logger;
            local_23d0 = local_2450;
            local_23d8 = local_2460;
            local_2398 = local_2450;
            local_23a0 = local_2460;
            std::operator<<((ostream *)(local_2450 + 0x10),local_2460);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x103f0a);
          }
        }
        if (local_298c != 0x578) {
          local_2938 = &Logger;
          local_2940 = "Corrupted data: Wrong size";
          local_2370 = &Logger;
          local_2374 = 4;
          local_2380 = "Corrupted data: Wrong size";
          local_2360 = &Logger;
          local_2364 = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1fd8 = &Logger;
            local_1fdc = 4;
            local_1fe8 = "Corrupted data: Wrong size";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_1fc8 = 0x12d358;
            local_1fb8 = &Logger;
            local_1fd0 = local_1fe8;
            local_1fa0 = &Logger;
            local_1fc0 = local_2170;
            local_1fb0 = local_1fc8;
            local_1fa8 = local_2170;
            local_1f98 = local_1fc8;
            local_1f90 = local_2170;
            std::operator<<(aoStack_2160,(string *)&Logger.Prefix);
            local_1f18 = &Logger;
            local_1f20 = local_1fc0;
            local_1f28 = local_1fd0;
            local_1f08 = local_1fc0;
            local_1f10 = local_1fd0;
            std::operator<<((ostream *)(local_1fc0 + 0x10),local_1fd0);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x104191);
          }
        }
        local_2990 = tonk::ReadU24_LE(local_2988 + 6);
        if (local_2990 != 0xadd12d) {
          local_2918 = &Logger;
          local_2920 = "Corrupted data: Bad magic";
          local_1eb8 = &Logger;
          local_1ebc = 4;
          local_1ec8 = "Corrupted data: Bad magic";
          local_1ea8 = &Logger;
          local_1eac = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1b20 = &Logger;
            local_1b24 = 4;
            local_1b30 = "Corrupted data: Bad magic";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_1918 = 0x12d358;
            local_1908 = &Logger;
            local_1920 = local_1b30;
            local_18f0 = &Logger;
            local_1910 = local_1cb8;
            local_1900 = local_1918;
            local_18f8 = local_1cb8;
            local_18e8 = local_1918;
            local_18e0 = local_1cb8;
            std::operator<<(aoStack_1ca8,(string *)&Logger.Prefix);
            local_1868 = &Logger;
            local_1870 = local_1910;
            local_1878 = local_1920;
            local_1830 = local_1910;
            local_1838 = local_1920;
            std::operator<<((ostream *)(local_1910 + 0x10),local_1920);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x104434);
          }
        }
        local_2994 = tonk::ReadU32_LE(local_2988 + 9);
        if (*(uint32_t *)(in_RDI + 0x1f94) != local_2994) {
          local_28e8 = &Logger;
          local_28f0 = "Corrupted data: Incorrect packet id";
          local_1808 = &Logger;
          local_180c = 4;
          local_1818 = "Corrupted data: Incorrect packet id";
          local_17f8 = &Logger;
          local_17fc = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1298 = &Logger;
            local_129c = 4;
            local_12a8 = "Corrupted data: Incorrect packet id";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_1288 = 0x12d358;
            local_1278 = &Logger;
            local_1290 = local_12a8;
            local_1260 = &Logger;
            local_1280 = local_1430;
            local_1270 = local_1288;
            local_1268 = local_1430;
            local_1258 = local_1288;
            local_1250 = local_1430;
            std::operator<<(aoStack_1420,(string *)&Logger.Prefix);
            local_1178 = &Logger;
            local_1180 = local_1280;
            local_1188 = local_1290;
            local_1168 = local_1280;
            local_1170 = local_1290;
            std::operator<<((ostream *)(local_1280 + 0x10),local_1290);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1046eb);
          }
        }
        *(uint32_t *)(in_RDI + 0x1f94) = local_2994 + 1;
        for (local_2998 = 0xd; local_2998 < local_298c; local_2998 = local_2998 + 1) {
        }
      }
      else if (*in_RDX == 8) {
        if (in_ESI != 0x98) {
          local_2968 = &Logger;
          local_2970 = "Corrupted data: Wrong channel";
          local_27e8 = &Logger;
          local_27ec = 4;
          local_27f8 = "Corrupted data: Wrong channel";
          local_27d8 = &Logger;
          local_27dc = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_2618 = &Logger;
            local_261c = 4;
            local_2628 = "Corrupted data: Wrong channel";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_2438 = 0x12d358;
            local_2428 = &Logger;
            local_2440 = local_2628;
            local_2410 = &Logger;
            local_2430 = local_27b0;
            local_2420 = local_2438;
            local_2418 = local_27b0;
            local_23b0 = local_2438;
            local_23a8 = local_27b0;
            std::operator<<(aoStack_27a0,(string *)&Logger.Prefix);
            local_23e0 = &Logger;
            local_23e8 = local_2430;
            local_23f0 = local_2440;
            local_2388 = local_2430;
            local_2390 = local_2440;
            std::operator<<((ostream *)(local_2430 + 0x10),local_2440);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1049db);
          }
        }
        if (local_298c != 0x578) {
          local_2948 = &Logger;
          local_2950 = "Corrupted data: Wrong size";
          local_2348 = &Logger;
          local_234c = 4;
          local_2358 = "Corrupted data: Wrong size";
          local_2338 = &Logger;
          local_233c = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_2188 = &Logger;
            local_218c = 4;
            local_2198 = "Corrupted data: Wrong size";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_1f80 = 0x12d358;
            local_1f70 = &Logger;
            local_1f88 = local_2198;
            local_1f58 = &Logger;
            local_1f78 = local_2320;
            local_1f68 = local_1f80;
            local_1f60 = local_2320;
            local_1f50 = local_1f80;
            local_1f48 = local_2320;
            std::operator<<(aoStack_2310,(string *)&Logger.Prefix);
            local_1f30 = &Logger;
            local_1f38 = local_1f78;
            local_1f40 = local_1f88;
            local_1ef8 = local_1f78;
            local_1f00 = local_1f88;
            std::operator<<((ostream *)(local_1f78 + 0x10),local_1f88);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x104c62);
          }
        }
        local_299a = tonk::ReadU16_LE(local_2988 + 1);
        local_29a0 = tonk::ReadU24_LE(local_2988 + 3);
        local_29a8 = tonk::SDKConnection::FromLocalTime16
                               ((SDKConnection *)in_stack_ffffffffffffd320,
                                (uint16_t)((ulong)in_stack_ffffffffffffd318 >> 0x30));
        local_29b0 = tonk::SDKConnection::FromLocalTime23
                               ((SDKConnection *)in_stack_ffffffffffffd320,
                                (uint32_t)((ulong)in_stack_ffffffffffffd318 >> 0x20));
        local_29b4 = tonk::ReadU24_LE(local_2988 + 6);
        if (local_29b4 != 0xadd12d) {
          local_2928 = &Logger;
          local_2930 = "Corrupted data: Bad magic";
          local_1e90 = &Logger;
          local_1e94 = 4;
          local_1ea0 = "Corrupted data: Bad magic";
          local_1e80 = &Logger;
          local_1e84 = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1cd0 = &Logger;
            local_1cd4 = 4;
            local_1ce0 = "Corrupted data: Bad magic";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_18d0 = 0x12d358;
            local_18c0 = &Logger;
            local_18d8 = local_1ce0;
            local_18a8 = &Logger;
            local_18c8 = local_1e68;
            local_18b8 = local_18d0;
            local_18b0 = local_1e68;
            local_18a0 = local_18d0;
            local_1898 = local_1e68;
            std::operator<<(aoStack_1e58,(string *)&Logger.Prefix);
            local_1880 = &Logger;
            local_1888 = local_18c8;
            local_1890 = local_18d8;
            local_1820 = local_18c8;
            local_1828 = local_18d8;
            std::operator<<((ostream *)(local_18c8 + 0x10),local_18d8);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x104f73);
          }
        }
        local_29b8 = tonk::ReadU32_LE(local_2988 + 9);
        if (*(uint32_t *)(in_RDI + 0x1f94) != local_29b8) {
          local_28f8 = &Logger;
          local_2900 = "Corrupted data: Incorrect packet id";
          local_17e0 = &Logger;
          local_17e4 = 4;
          local_17f0 = "Corrupted data: Incorrect packet id";
          local_17d0 = &Logger;
          local_17d4 = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_1448 = &Logger;
            local_144c = 4;
            local_1458 = "Corrupted data: Incorrect packet id";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_1240 = 0x12d358;
            local_1230 = &Logger;
            local_1248 = local_1458;
            local_1218 = &Logger;
            local_1238 = local_15e0;
            local_1228 = local_1240;
            local_1220 = local_15e0;
            local_1210 = local_1240;
            local_1208 = local_15e0;
            std::operator<<(aoStack_15d0,(string *)&Logger.Prefix);
            local_1190 = &Logger;
            local_1198 = local_1238;
            local_11a0 = local_1248;
            local_1158 = local_1238;
            local_1160 = local_1248;
            std::operator<<((ostream *)(local_1238 + 0x10),local_1248);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10522a);
          }
        }
        *(uint32_t *)(in_RDI + 0x1f94) = local_29b8 + 1;
        for (local_29bc = 0xd; local_29bc < local_298c; local_29bc = local_29bc + 1) {
        }
        tonk::SDKConnection::GetStatus((SDKConnection *)in_stack_ffffffffffffd320);
        if ((local_29d4 & 1) != 0) {
          local_29e0 = tonk_time();
          local_29e8 = local_29e0 - local_29b0;
          test::OWDTimeStatistics::AddSample(in_stack_ffffffffffffd330,in_stack_ffffffffffffd328);
          if (999999 < local_29e0 - *(long *)(in_RDI + 0x1f88)) {
            *(uint64_t *)(in_RDI + 0x1f88) = local_29e0;
            local_29ec = (int)local_29e0 - (int)local_29a8;
            local_29f0 = (int)local_29e0 - (int)local_29b0;
            local_28b0 = &Logger;
            local_28b8 = "DATA RESULT: Transmission time (acc=16) = ";
            local_28c0 = &local_29ec;
            local_28c8 = ", (acc=23) = ";
            local_28d0 = &local_29f0;
            local_28d8 = " # ";
            local_28e0 = &local_29b8;
            local_1108 = &Logger;
            local_110c = 2;
            local_1118 = "DATA RESULT: Transmission time (acc=16) = ";
            local_1128 = ", (acc=23) = ";
            local_1138 = " # ";
            local_10f8 = &Logger;
            local_10fc = 2;
            local_1140 = local_28e0;
            local_1130 = local_28d0;
            local_1120 = local_28c0;
            if ((int)Logger.ChannelMinLevel < 3) {
              local_f20 = &Logger;
              local_f24 = 2;
              local_f30 = "DATA RESULT: Transmission time (acc=16) = ";
              local_f40 = ", (acc=23) = ";
              local_f50 = " # ";
              local_f58 = local_28e0;
              local_f48 = local_28d0;
              local_f38 = local_28c0;
              logger::LogStringBuffer::LogStringBuffer
                        (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
              local_ee8 = 0x12d358;
              local_ed8 = &Logger;
              local_ef0 = local_f30;
              local_ef8 = local_f38;
              local_f00 = local_f40;
              local_f08 = local_f48;
              local_f10 = local_f50;
              local_f18 = local_f58;
              local_ec0 = &Logger;
              local_ee0 = local_10e0;
              local_ed0 = local_ee8;
              local_ec8 = local_10e0;
              local_eb8 = local_ee8;
              local_eb0 = local_10e0;
              std::operator<<(aoStack_10d0,(string *)&Logger.Prefix);
              local_e70 = &Logger;
              local_e78 = local_ee0;
              local_e80 = local_ef0;
              local_e88 = local_ef8;
              local_e90 = local_f00;
              local_e98 = local_f08;
              local_ea0 = local_f10;
              local_ea8 = local_f18;
              local_e58 = &Logger;
              local_e60 = local_ee0;
              local_e68 = local_ef0;
              local_e10 = local_ee0;
              local_e18 = local_ef0;
              std::operator<<((ostream *)(local_ee0 + 0x10),local_ef0);
              local_e20 = &Logger;
              local_e28 = local_e78;
              local_e30 = local_e88;
              local_e38 = local_e90;
              local_e40 = local_e98;
              local_e48 = local_ea0;
              local_e50 = local_ea8;
              local_df8 = &Logger;
              local_e00 = local_e78;
              local_e08 = local_e88;
              local_db8 = local_e78;
              local_dc0 = local_e88;
              std::ostream::operator<<((ostream *)(local_e78 + 0x10),*local_e88);
              local_dc8 = &Logger;
              local_dd0 = local_e28;
              local_dd8 = local_e38;
              local_de0 = local_e40;
              local_de8 = local_e48;
              local_df0 = local_e50;
              local_da0 = &Logger;
              local_da8 = local_e28;
              local_db0 = local_e38;
              local_d40 = local_e28;
              local_d48 = local_e38;
              std::operator<<((ostream *)(local_e28 + 0x10),local_e38);
              local_d78 = &Logger;
              local_d80 = local_dd0;
              local_d88 = local_de0;
              local_d90 = local_de8;
              local_d98 = local_df0;
              local_d60 = &Logger;
              local_d68 = local_dd0;
              local_d70 = local_de0;
              local_d50 = local_dd0;
              local_d58 = local_de0;
              std::ostream::operator<<((ostream *)(local_dd0 + 0x10),*local_de0);
              local_d20 = &Logger;
              local_d28 = local_d80;
              local_d30 = local_d90;
              local_d38 = local_d98;
              local_d08 = &Logger;
              local_d10 = local_d80;
              local_d18 = local_d90;
              local_ce0 = local_d80;
              local_ce8 = local_d90;
              std::operator<<((ostream *)(local_d80 + 0x10),local_d90);
              local_cf0 = &Logger;
              local_cf8 = local_d28;
              local_d00 = local_d38;
              local_cd0 = local_d28;
              local_cd8 = local_d38;
              std::ostream::operator<<((ostream *)(local_d28 + 0x10),*local_d38);
              logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
              logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x105b36);
            }
            test::OWDTimeStatistics::PrintStatistics(in_stack_ffffffffffffd5e0);
          }
        }
      }
      else if (*in_RDX == 3) {
        local_29f4 = tonk::ReadU32_LE(in_RDX + 1);
        local_2898 = &Logger;
        local_28a0 = "Server reported new connection: ID = ";
        local_28a8 = &local_29f4;
        local_cb0 = &Logger;
        local_cb4 = 2;
        local_cc0 = "Server reported new connection: ID = ";
        local_ca0 = &Logger;
        local_ca4 = 2;
        if ((int)Logger.ChannelMinLevel < 3) {
          local_ae8 = &Logger;
          local_aec = 2;
          local_af8 = "Server reported new connection: ID = ";
          local_cc8 = local_28a8;
          local_b00 = local_28a8;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
          local_ad0 = 0x12d358;
          local_ac0 = &Logger;
          local_ad8 = local_af8;
          local_ae0 = local_b00;
          local_aa8 = &Logger;
          local_ac8 = local_c88;
          local_ab8 = local_ad0;
          local_ab0 = local_c88;
          local_aa0 = local_ad0;
          local_a98 = local_c88;
          std::operator<<(aoStack_c78,(string *)&Logger.Prefix);
          local_a78 = &Logger;
          local_a80 = local_ac8;
          local_a88 = local_ad8;
          local_a90 = local_ae0;
          local_a60 = &Logger;
          local_a68 = local_ac8;
          local_a70 = local_ad8;
          local_a28 = local_ac8;
          local_a30 = local_ad8;
          std::operator<<((ostream *)(local_ac8 + 0x10),local_ad8);
          local_a48 = &Logger;
          local_a50 = local_a80;
          local_a58 = local_a90;
          local_a38 = local_a80;
          local_a40 = local_a90;
          std::ostream::operator<<((ostream *)(local_a80 + 0x10),*local_a90);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x105ee3);
        }
      }
      else if (*in_RDX == 4) {
        local_29f8 = tonk::ReadU32_LE(in_RDX + 1);
        local_2880 = &Logger;
        local_2888 = "Server reported removed connection: ID = ";
        local_2890 = &local_29f8;
        local_a08 = &Logger;
        local_a0c = 2;
        local_a18 = "Server reported removed connection: ID = ";
        local_9f8 = &Logger;
        local_9fc = 2;
        if ((int)Logger.ChannelMinLevel < 3) {
          local_840 = &Logger;
          local_844 = 2;
          local_850 = "Server reported removed connection: ID = ";
          local_a20 = local_2890;
          local_858 = local_2890;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
          local_828 = 0x12d358;
          local_818 = &Logger;
          local_830 = local_850;
          local_838 = local_858;
          local_800 = &Logger;
          local_820 = local_9e0;
          local_810 = local_828;
          local_808 = local_9e0;
          local_7f8 = local_828;
          local_7f0 = local_9e0;
          std::operator<<(aoStack_9d0,(string *)&Logger.Prefix);
          local_7d0 = &Logger;
          local_7d8 = local_820;
          local_7e0 = local_830;
          local_7e8 = local_838;
          local_790 = &Logger;
          local_798 = local_820;
          local_7a0 = local_830;
          local_780 = local_820;
          local_788 = local_830;
          std::operator<<((ostream *)(local_820 + 0x10),local_830);
          local_7b8 = &Logger;
          local_7c0 = local_7d8;
          local_7c8 = local_7e8;
          local_7a8 = local_7d8;
          local_7b0 = local_7e8;
          std::ostream::operator<<((ostream *)(local_7d8 + 0x10),*local_7e8);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10627b);
        }
      }
      else if (*in_RDX == 5) {
        local_29fc = tonk::ReadU24_LE(in_RDX + 1);
        local_2a08 = local_2988 + 4;
        local_2850 = &Logger;
        local_2858 = "Server rebroadcast from ID = ";
        local_2860 = &local_29fc;
        local_2868 = ": `";
        local_2870 = &local_2a08;
        local_2878 = "`";
        local_748 = &Logger;
        local_74c = 2;
        local_758 = "Server rebroadcast from ID = ";
        local_768 = ": `";
        local_778 = "`";
        local_738 = &Logger;
        local_73c = 2;
        if ((int)Logger.ChannelMinLevel < 3) {
          local_568 = &Logger;
          local_56c = 2;
          local_578 = "Server rebroadcast from ID = ";
          local_588 = ": `";
          local_598 = "`";
          local_770 = local_2870;
          local_760 = local_2860;
          local_590 = local_2870;
          local_580 = local_2860;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
          local_538 = 0x12d358;
          local_528 = &Logger;
          local_540 = local_578;
          local_548 = local_580;
          local_550 = local_588;
          local_558 = local_590;
          local_560 = local_598;
          local_510 = &Logger;
          local_530 = local_720;
          local_520 = local_538;
          local_518 = local_720;
          local_508 = local_538;
          local_500 = local_720;
          std::operator<<(aoStack_710,(string *)&Logger.Prefix);
          local_4c8 = &Logger;
          local_4d0 = local_530;
          local_4d8 = local_540;
          local_4e0 = local_548;
          local_4e8 = local_550;
          local_4f0 = local_558;
          local_4f8 = local_560;
          local_4b0 = &Logger;
          local_4b8 = local_530;
          local_4c0 = local_540;
          local_4a0 = local_530;
          local_4a8 = local_540;
          std::operator<<((ostream *)(local_530 + 0x10),local_540);
          local_470 = &Logger;
          local_478 = local_4d0;
          local_480 = local_4e0;
          local_488 = local_4e8;
          local_490 = local_4f0;
          local_498 = local_4f8;
          local_458 = &Logger;
          local_460 = local_4d0;
          local_468 = local_4e0;
          local_448 = local_4d0;
          local_450 = local_4e0;
          std::ostream::operator<<((ostream *)(local_4d0 + 0x10),*local_4e0);
          local_420 = &Logger;
          local_428 = local_478;
          local_430 = local_488;
          local_438 = local_490;
          local_440 = local_498;
          local_408 = &Logger;
          local_410 = local_478;
          local_418 = local_488;
          local_3f8 = local_478;
          local_400 = local_488;
          std::operator<<((ostream *)(local_478 + 0x10),local_488);
          local_3d8 = &Logger;
          local_3e0 = local_428;
          local_3e8 = local_438;
          local_3f0 = local_440;
          local_3c0 = &Logger;
          local_3c8 = local_428;
          local_3d0 = local_438;
          local_398 = local_428;
          local_3a0 = local_438;
          std::operator<<((ostream *)(local_428 + 0x10),(char *)*local_438);
          local_3a8 = &Logger;
          local_3b0 = local_3e0;
          local_3b8 = local_3f0;
          local_388 = local_3e0;
          local_390 = local_3f0;
          std::operator<<((ostream *)(local_3e0 + 0x10),local_3f0);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x106971);
        }
      }
      else if (*in_RDX == 6) {
        local_2840 = &Logger;
        local_2848 = "Got pre-connect data test";
        local_1ee0 = &Logger;
        local_1ee4 = 1;
        local_1ef0 = "Got pre-connect data test";
        local_1ed0 = &Logger;
        local_1ed4 = 1;
        local_297c = in_ESI;
        if ((int)Logger.ChannelMinLevel < 2) {
          local_1970 = &Logger;
          local_1974 = 1;
          local_1980 = "Got pre-connect data test";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
          local_1960 = 0x12d358;
          local_1950 = &Logger;
          local_1968 = local_1980;
          local_1938 = &Logger;
          local_1958 = local_1b08;
          local_1948 = local_1960;
          local_1940 = local_1b08;
          local_1930 = local_1960;
          local_1928 = local_1b08;
          std::operator<<(aoStack_1af8,(string *)&Logger.Prefix);
          local_1850 = &Logger;
          local_1858 = local_1958;
          local_1860 = local_1968;
          local_1840 = local_1958;
          local_1848 = local_1968;
          std::operator<<((ostream *)(local_1958 + 0x10),local_1968);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x106be8);
        }
        local_2a09 = test::ValidatePreconnectData(local_297c,local_2988,local_298c);
        if (!(bool)local_2a09) {
          local_2908 = &Logger;
          local_2910 = "ERROR: Preconnect data was invalid!";
          local_17b8 = &Logger;
          local_17bc = 4;
          local_17c8 = "ERROR: Preconnect data was invalid!";
          local_17a8 = &Logger;
          local_17ac = 4;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_15f8 = &Logger;
            local_15fc = 4;
            local_1608 = "ERROR: Preconnect data was invalid!";
            pCVar1 = &Logger;
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
            local_11f8 = (string *)
                         ((((OutputWorker *)pCVar1)->QueueLock).super___mutex_base._M_mutex.__size +
                         0x10);
            local_1200 = local_1608;
            this_00 = (OutputWorker *)pCVar1;
            local_11f0 = local_1790;
            local_11e8 = (OutputWorker *)pCVar1;
            local_11e0 = local_11f8;
            local_11d8 = local_1790;
            local_11d0 = (OutputWorker *)pCVar1;
            local_11c8 = local_11f8;
            local_11c0 = local_1790;
            std::operator<<(aoStack_1780,local_11f8);
            local_11b0 = local_11f0;
            local_11b8 = local_1200;
            local_1148 = local_11f0;
            local_1150 = local_1200;
            local_11a8 = (OutputWorker *)pCVar1;
            std::operator<<((ostream *)(local_11f0 + 0x10),local_1200);
            buffer_15 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(this_00,buffer_15);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x106e6c);
          }
        }
      }
      else {
        local_2a10 = (uint)*in_RDX;
        local_2818 = &Logger;
        local_2820 = "MyServerConnection: Got ";
        local_2828 = &local_298c;
        local_2830 = " bytes of message data unexpected type ";
        local_2838 = &local_2a10;
        local_358 = &Logger;
        local_35c = 4;
        local_368 = "MyServerConnection: Got ";
        local_378 = " bytes of message data unexpected type ";
        local_348 = &Logger;
        local_34c = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_180 = &Logger;
          local_184 = 4;
          local_190 = "MyServerConnection: Got ";
          local_1a0 = " bytes of message data unexpected type ";
          local_380 = local_2838;
          local_370 = local_2828;
          local_1a8 = local_2838;
          local_198 = local_2828;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,Trace);
          local_158 = 0x12d358;
          local_148 = &Logger;
          local_160 = local_190;
          local_168 = local_198;
          local_170 = local_1a0;
          local_178 = local_1a8;
          local_130 = &Logger;
          local_150 = local_330;
          local_140 = local_158;
          local_138 = local_330;
          local_128 = local_158;
          local_120 = local_330;
          std::operator<<(aoStack_320,(string *)&Logger.Prefix);
          local_f0 = &Logger;
          local_f8 = local_150;
          local_100 = local_160;
          local_108 = local_168;
          local_110 = local_170;
          local_118 = local_178;
          pCVar1 = &Logger;
          local_d8 = &Logger;
          local_e0 = local_150;
          local_e8 = local_160;
          local_78 = local_150;
          local_80 = local_160;
          std::operator<<((ostream *)(local_150 + 0x10),local_160);
          local_b8 = local_f8;
          local_c0 = local_108;
          local_c8 = local_110;
          local_d0 = local_118;
          local_a0 = local_f8;
          local_a8 = local_108;
          local_88 = local_f8;
          local_90 = local_108;
          local_b0 = pCVar1;
          local_98 = pCVar1;
          std::ostream::operator<<((ostream *)(local_f8 + 0x10),*local_108);
          local_60 = local_b8;
          local_68 = local_c8;
          local_70 = local_d0;
          local_20 = local_b8;
          local_28 = local_c8;
          local_8 = local_b8;
          local_10 = local_c8;
          local_58 = pCVar1;
          local_18 = pCVar1;
          std::operator<<((ostream *)(local_b8 + 0x10),local_c8);
          local_48 = local_60;
          local_50 = local_70;
          local_30 = local_60;
          local_38 = local_70;
          local_40 = pCVar1;
          std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1073da);
        }
      }
    }
  }
  return;
}

Assistant:

void MyClientConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_LowPri0 + 5 ||
        channel == TonkChannel_Reliable0 + 5)
    {
        // Ignore some test data
        return;
    }

    if (bytes <= 0) {
        return;
    }

    if (data[0] == 200)
    {
        static uint8_t expected = 0;
        ++expected;
        if (data[1] != expected)
        {
            //Logger.Info("UNORDERED: ", (int)data[1]);
            expected = data[1];
        }
        return;
    }

    if (data[0] == ID_LowPriBulkData_NoTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        if (channel != kLowPriBulkData_Channel) {
            Logger.Error("Corrupted data: Wrong channel");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        if (bytes != kLowPriBulkData_Bytes) {
            Logger.Error("Corrupted data: Wrong size");
        }
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        return;
    }

    if (data[0] == ID_LowPriBulkData_HasTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        if (channel != kLowPriBulkData_Channel) {
            Logger.Error("Corrupted data: Wrong channel");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        if (bytes != kLowPriBulkData_Bytes) {
            Logger.Error("Corrupted data: Wrong size");
        }
        uint16_t ts16 = tonk::ReadU16_LE(data + 1);
        uint32_t ts23 = tonk::ReadU24_LE(data + 1 + 2);
        uint64_t lo16 = FromLocalTime16(ts16);
        uint64_t lo23 = FromLocalTime23(ts23);
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        if (0 != (GetStatus().Flags & TonkFlag_TimeSync))
        {
            uint64_t nowUsec = tonk_time();
            uint64_t owdUsec = nowUsec - lo23;
            OWDStats.AddSample(owdUsec);

            if (nowUsec - LastStatsUsec >= 1000000)
            {
                LastStatsUsec = nowUsec;
#ifdef ENABLE_P2P_DATA_RESULT
                Logger.Info("DATA RESULT: Transmission time (acc=16) = ", (int)(nowUsec - lo16), ", (acc=23) = ", (int)(nowUsec - lo23), " # ", packetIndex);
                OWDStats.PrintStatistics();
#endif
            }
        }

        return;
    }
    if (data[0] == ID_ConnectionAdded)
    {
        const uint32_t id = tonk::ReadU32_LE(data + 1);
        Logger.Info("Server reported new connection: ID = ", id);
        return;
    }
    if (data[0] == ID_ConnectionRemoved)
    {
        const uint32_t id = tonk::ReadU32_LE(data + 1);
        Logger.Info("Server reported removed connection: ID = ", id);
        return;
    }
    if (data[0] == ID_ConnectionRebroadcast)
    {
        const uint32_t id = tonk::ReadU24_LE(data + 1);
        const char* msgStart = (char*)data + 1 + 3;

        Logger.Info("Server rebroadcast from ID = ", id, ": `", msgStart, "`");
        return;
    }
    if (data[0] == ID_PreConnectDataTest)
    {
        Logger.Debug("Got pre-connect data test");

        const bool validated = ValidatePreconnectData(channel, data, bytes);

        if (!validated) {
            Logger.Error("ERROR: Preconnect data was invalid!");
            TONK_CPP_SDK_DEBUG_BREAK();
        }
        return;
    }

    Logger.Error("MyServerConnection: Got ", bytes, " bytes of message data unexpected type ", (int)data[0]);
    TONK_CPP_SDK_DEBUG_BREAK();
}